

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void Test_CheckNOTNULL_Simple::RunTest(void)

{
  void **ppvVar1;
  long *local_40;
  int *local_38;
  uchar *local_30;
  char *local_28;
  void *local_20;
  void *ref;
  void *ptr;
  int64 t;
  
  ref = &ptr;
  ppvVar1 = google::CheckNotNull<void*&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                       ,0x260,"\'ptr\' Must be non NULL",&ref);
  local_20 = *ppvVar1;
  if (ref != local_20) {
    fprintf(_stderr,"Check failed: %s %s %s\n","ptr","==","ref");
    exit(1);
  }
  local_28 = (char *)ref;
  google::CheckNotNull<char*>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x262,"\'reinterpret_cast<char *>(ptr)\' Must be non NULL",&local_28);
  local_30 = (uchar *)ref;
  google::CheckNotNull<unsigned_char*>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x263,"\'reinterpret_cast<unsigned char *>(ptr)\' Must be non NULL",&local_30);
  local_38 = (int *)ref;
  google::CheckNotNull<int*>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x264,"\'reinterpret_cast<int *>(ptr)\' Must be non NULL",&local_38);
  local_40 = (long *)ref;
  google::CheckNotNull<long*>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x265,"\'reinterpret_cast<int64 *>(ptr)\' Must be non NULL",&local_40);
  return;
}

Assistant:

TEST(CheckNOTNULL, Simple) {
  int64 t;
  void *ptr = static_cast<void *>(&t);
  void *ref = CHECK_NOTNULL(ptr);
  EXPECT_EQ(ptr, ref);
  CHECK_NOTNULL(reinterpret_cast<char *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<unsigned char *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<int *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<int64 *>(ptr));
}